

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataFunctionNames.cpp
# Opt level: O1

void findMetadataFunctionNames(Module *module,Program *program)

{
  char *pcVar1;
  Program *this;
  char cVar2;
  bool bVar3;
  int iVar4;
  Module *pMVar5;
  Func *pFVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  char *pcVar8;
  Function *pFVar9;
  Module *f;
  Function *pFVar10;
  Function *pFVar11;
  Function *pFVar12;
  long lVar13;
  pointer psVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  regex varName;
  undefined1 local_d8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  long local_b0;
  char local_a8;
  undefined7 uStack_a7;
  Program *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  Module *local_70;
  Module *local_68;
  Function *local_60;
  Func *local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  pMVar5 = *(Module **)(module + 0x20);
  local_70 = module + 0x18;
  local_98 = program;
  if (pMVar5 != local_70) {
    do {
      f = pMVar5 + -0x38;
      if (pMVar5 == (Module *)0x0) {
        f = (Module *)0x0;
      }
      local_68 = pMVar5;
      cVar2 = llvm::GlobalValue::isDeclaration();
      this = local_98;
      if (cVar2 == '\0') {
        pFVar6 = Program::getFunction(local_98,(Function *)f);
        psVar7 = Program::getGlobalVarNames_abi_cxx11_(this);
        local_58 = pFVar6;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pFVar6->metadataVarNames,
                   (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&(psVar7->_M_t)._M_impl.super__Rb_tree_header);
        pFVar11 = *(Function **)((Function *)f + 0x50);
        local_60 = (Function *)f + 0x48;
        if (pFVar11 != local_60) {
          do {
            pFVar10 = pFVar11 + -0x18;
            if (pFVar11 == (Function *)0x0) {
              pFVar10 = (Function *)0x0;
            }
            for (pFVar9 = *(Function **)(pFVar10 + 0x30); pFVar9 != pFVar10 + 0x28;
                pFVar9 = *(Function **)(pFVar9 + 8)) {
              pFVar12 = pFVar9 + -0x18;
              if (pFVar9 == (Function *)0x0) {
                pFVar12 = (Function *)0x0;
              }
              if (pFVar12[0x10] == (Function)0x53) {
                lVar13 = *(long *)(pFVar12 + -0x20);
                if ((lVar13 == 0) || (*(char *)(lVar13 + 0x10) != '\0')) {
                  lVar13 = 0;
                }
                if ((lVar13 == 0) || (*(long *)(lVar13 + 0x18) != *(long *)(pFVar12 + 0x48))) {
                  bVar3 = true;
                }
                else {
                  bVar3 = false;
                }
                if (bVar3) {
                  bVar15 = false;
                }
                else {
                  auVar16 = llvm::Value::getName();
                  lVar13 = auVar16._0_8_;
                  if (lVar13 == 0) {
                    local_90 = &local_80;
                    local_88 = 0;
                    local_80 = 0;
                  }
                  else {
                    local_90 = &local_80;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_90,lVar13,auVar16._8_8_ + lVar13);
                  }
                  iVar4 = std::__cxx11::string::compare((char *)&local_90);
                  bVar15 = iVar4 == 0;
                }
                if ((!bVar3) && (local_90 != &local_80)) {
                  operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
                }
                if (bVar15) {
                  if ((*(uint *)(pFVar12 + 0x14) >> 0x1e & 1) == 0) {
                    lVar13 = (long)pFVar12 - (ulong)(*(uint *)(pFVar12 + 0x14) << 5);
                  }
                  else {
                    lVar13 = *(long *)(pFVar12 + -8);
                  }
                  lVar13 = *(long *)(lVar13 + 0x20);
                  if (*(char *)(lVar13 + 0x10) != '\x16') {
                    lVar13 = 0;
                  }
                  pcVar1 = *(char **)(lVar13 + 0x18);
                  pcVar8 = (char *)0x0;
                  if ((pcVar1 != (char *)0x0) && (pcVar8 = pcVar1, *pcVar1 != '\x19')) {
                    pcVar8 = (char *)0x0;
                  }
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                            (&local_50,"var[0-9]+",0x10);
                  if (*(long *)(pcVar8 + (ulong)*(uint *)(pcVar8 + 8) * -8 + 8) == 0) {
                    auVar16 = ZEXT816(0);
                  }
                  else {
                    auVar16 = llvm::MDString::getString();
                  }
                  lVar13 = auVar16._0_8_;
                  if (lVar13 == 0) {
                    local_b8._M_current = &local_a8;
                    local_b0 = 0;
                    local_a8 = '\0';
                  }
                  else {
                    local_b8._M_current = &local_a8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_b8,lVar13,auVar16._8_8_ + lVar13);
                  }
                  local_d8._16_8_ = (pointer)0x0;
                  local_d8._24_8_ = (char *)0x0;
                  local_d8._0_8_ = (pointer)0x0;
                  local_d8._8_8_ = (pointer)0x0;
                  bVar3 = std::__detail::
                          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                    (local_b8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               )(local_b8._M_current + local_b0),
                                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)local_d8,&local_50,0);
                  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
                  }
                  if (local_b8._M_current != &local_a8) {
                    operator_delete(local_b8._M_current,CONCAT71(uStack_a7,local_a8) + 1);
                  }
                  if (bVar3) {
                    if (*(long *)(pcVar8 + (ulong)*(uint *)(pcVar8 + 8) * -8 + 8) == 0) {
                      auVar16 = ZEXT816(0);
                    }
                    else {
                      auVar16 = llvm::MDString::getString();
                    }
                    lVar13 = auVar16._0_8_;
                    psVar14 = (pointer)(local_d8 + 0x10);
                    local_d8._0_8_ = psVar14;
                    if (lVar13 == 0) {
                      local_d8._8_8_ = (pointer)0x0;
                      local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
                    }
                    else {
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_d8,lVar13,auVar16._8_8_ + lVar13);
                    }
                    Func::addMetadataVarName(local_58,(string *)local_d8);
                    if ((pointer)local_d8._0_8_ != psVar14) {
                      operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
                    }
                  }
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            (&local_50);
                }
              }
            }
            pFVar11 = *(Function **)(pFVar11 + 8);
          } while (pFVar11 != local_60);
        }
      }
      pMVar5 = *(Module **)(local_68 + 8);
    } while (pMVar5 != local_70);
  }
  Program::addPass(local_98,FindMetadataFunctionNames);
  return;
}

Assistant:

void findMetadataFunctionNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateFunctions));

    for (const llvm::Function& func : module->functions()) {
        if (func.isDeclaration())
            continue;

        auto function = program.getFunction(&func);
        assert(function && "Do not have function");

        function->fillMetadataVarNames(program.getGlobalVarNames());

        for (const llvm::BasicBlock& block : func) {
            for (const llvm::Instruction& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const auto CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction() && CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                        llvm::Metadata* varMD = llvm::dyn_cast_or_null<llvm::MetadataAsValue>(ins.getOperand(1))->getMetadata();
                        llvm::DILocalVariable* localVar = llvm::dyn_cast_or_null<llvm::DILocalVariable>(varMD);

                        std::regex varName("var[0-9]+");
                        if (std::regex_match(localVar->getName().str(), varName)) {
                            function->addMetadataVarName(localVar->getName().str());
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::FindMetadataFunctionNames);
}